

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O3

void test_array_append(void)

{
  uint uVar1;
  VALUE *pVVar2;
  size_t sVar3;
  int i32;
  VALUE a;
  VALUE local_40;
  
  value_init_array(&local_40);
  i32 = 0;
  do {
    pVVar2 = value_array_append(&local_40);
    value_init_int32(pVVar2,i32);
    i32 = i32 + 1;
  } while (i32 != 100000);
  sVar3 = value_array_size(&local_40);
  acutest_check_((uint)(sVar3 == 100000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,699,"%s","value_array_size(&a) == N");
  sVar3 = 0;
  do {
    pVVar2 = value_array_get(&local_40,sVar3);
    uVar1 = value_int32(pVVar2);
    acutest_check_((uint)(sVar3 == uVar1),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2be,"%s","value_int32(v) == i");
    sVar3 = sVar3 + 1;
  } while (sVar3 != 100000);
  value_fini(&local_40);
  return;
}

Assistant:

static void
test_array_append(void)
{
    const int N = 100000;

    VALUE a;
    VALUE* v;
    int i;

    value_init_array(&a);
    for(i = 0; i < N; i++) {
        v = value_array_append(&a);
        value_init_int32(v, i);
    }
    TEST_CHECK(value_array_size(&a) == N);
    for(i = 0; i < N; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i);
    }
    value_fini(&a);
}